

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O0

void __thiscall draco::RAnsSymbolDecoder<10>::~RAnsSymbolDecoder(RAnsSymbolDecoder<10> *this)

{
  RAnsDecoder<15> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  
  RAnsDecoder<15>::~RAnsDecoder(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

RAnsSymbolDecoder() : num_symbols_(0) {}